

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::resolver::async_resolve
          (resolver *this,string *host,resolver_flags flags,callback_t *h)

{
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
  *this_00;
  _Any_data *__s;
  long lVar1;
  long lVar2;
  io_context *piVar3;
  pointer paVar4;
  size_t sVar5;
  string *__k;
  int iVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  char *pcVar10;
  iterator iVar11;
  time_point tVar12;
  iterator iVar13;
  long *plVar14;
  iterator __position;
  undefined7 in_register_00000011;
  undefined4 uVar15;
  size_t __n;
  undefined8 uVar16;
  _Any_data *__cp;
  ulong uVar17;
  undefined4 uVar18;
  string_view host_00;
  string_view host_01;
  string_view service;
  string_view service_00;
  bytes_type bytes;
  char src_buf [64];
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> ips;
  error_code error_code;
  ptr local_f8;
  callback_t *local_e0;
  _Any_data local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [8];
  undefined1 auStack_b0 [12];
  undefined4 uStack_a4;
  pointer paStack_a0;
  pointer paStack_98;
  ulong local_90;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  pointer local_78;
  uint local_64;
  string *local_60;
  io_context *local_58;
  undefined8 uStack_50;
  pointer local_48;
  pointer paStack_40;
  
  local_64 = (uint)CONCAT71(in_register_00000011,flags.m_val);
  __s = (_Any_data *)(host->_M_dataplus)._M_p;
  local_e0 = h;
  local_60 = host;
  piVar9 = __errno_location();
  *piVar9 = 0;
  pcVar10 = strchr(__s->_M_pod_data,0x25);
  __cp = __s;
  if (pcVar10 == (char *)0x0) {
LAB_0029ee2b:
    iVar6 = inet_pton(10,__cp->_M_pod_data,&local_f8);
    if (0 < iVar6) {
      iVar6 = *piVar9;
      if (pcVar10 == (char *)0x0) {
        uVar17 = 0;
      }
      else if (((((char)local_f8.a == -2) || ((char)local_f8.a != -1)) ||
               ((local_f8.a._1_1_ & 0xf) != 2)) || (uVar7 = if_nametoindex(pcVar10 + 1), uVar7 == 0)
              ) {
        iVar8 = atoi(pcVar10 + 1);
        uVar17 = (ulong)iVar8;
      }
      else {
        uVar17 = (ulong)uVar7;
      }
      local_88 = (undefined1  [8])local_f8.a;
      uStack_80 = (pointer)local_f8.v;
      if (iVar6 == 0) {
        local_48 = (pointer)local_f8.a;
        paStack_40 = (pointer)local_f8.v;
        uVar15 = 0;
        uVar18 = 1;
        goto LAB_0029f097;
      }
    }
  }
  else {
    __n = (long)pcVar10 - (long)__s;
    if ((long)__n < 0x40) {
      __cp = &local_d8;
      memcpy(__cp,__s,__n);
      local_d8._M_pod_data[__n] = '\0';
      goto LAB_0029ee2b;
    }
  }
  *piVar9 = 0;
  iVar6 = inet_pton(2,__s->_M_pod_data,&local_d8);
  __k = local_60;
  if ((iVar6 < 1) || (*piVar9 != 0)) {
    local_48 = (pointer)0x0;
    paStack_40 = (pointer)0x0;
    iVar11 = ::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->m_cache)._M_h,local_60);
    uVar7 = local_64;
    if ((iVar11.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
         ._M_cur == (__node_type *)0x0) ||
       (((local_64 & 1) == 0 &&
        (lVar1 = (this->m_timeout).__r,
        lVar2 = *(long *)((long)iVar11.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
                                ._M_cur + 0x28), tVar12 = time_now(),
        lVar1 + lVar2 < (long)tVar12.__d.__r)))) {
      iVar13 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&(this->m_failed_cache)._M_h,__k);
      if (iVar13.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
          ._M_cur == (__node_type *)0x0) {
        if ((uVar7 & 1) != 0) {
          paVar4 = (pointer)this->m_ios;
          ::std::
          function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
          ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                      *)&local_d8,local_e0);
          uStack_80._4_4_ = 1;
          local_88 = (undefined1  [8])paVar4;
          plVar14 = (long *)__tls_get_addr(&PTR_004eaf08);
          if (*plVar14 == 0) {
            uVar16 = 0;
          }
          else {
            uVar16 = *(undefined8 *)(*plVar14 + 8);
          }
          local_f8.a = (allocator<void> *)&uStack_80;
          local_f8.v = boost::asio::detail::thread_info_base::
                       allocate<boost::asio::detail::thread_info_base::default_tag>(uVar16,0x40);
          (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
             *)local_f8.v)->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
          (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
             *)local_f8.v)->super_scheduler_operation).func_ =
               boost::asio::detail::
               executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:145:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
               ::do_complete;
          (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
             *)local_f8.v)->super_scheduler_operation).task_result_ = 0;
          *(undefined8 *)
           &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
               *)local_f8.v)->handler_).h.super__Function_base._M_functor = 0;
          *(undefined8 *)
           ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                      *)local_f8.v)->handler_).h.super__Function_base._M_functor + 8) = 0;
          (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
             *)local_f8.v)->handler_).h.super__Function_base._M_manager = (_Manager_type)0x0;
          (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
             *)local_f8.v)->handler_).h._M_invoker = (_Invoker_type)local_c8._8_8_;
          if ((pointer)local_c8._M_allocated_capacity != (pointer)0x0) {
            *(void **)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                          *)local_f8.v)->handler_).h.super__Function_base._M_functor =
                 local_d8._M_unused._M_object;
            *(undefined8 *)
             ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                        *)local_f8.v)->handler_).h.super__Function_base._M_functor + 8) =
                 local_d8._8_8_;
            (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
               *)local_f8.v)->handler_).h.super__Function_base._M_manager =
                 (_Manager_type)local_c8._M_allocated_capacity;
            local_c8._M_allocated_capacity = 0;
            local_c8._8_8_ = (_Invoker_type)0x0;
          }
          local_f8.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                        *)local_f8.v;
          boost::asio::detail::scheduler::post_immediate_completion
                    (*(scheduler **)&(((address_v6 *)((long)local_88 + 8))->addr_).__in6_u,
                     (operation *)local_f8.v,SUB41((uStack_80._4_4_ & 2) >> 1,0));
          local_f8.v = (void *)0x0;
          local_f8.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                        *)0x0;
          boost::asio::detail::
          executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:145:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
          ::ptr::reset((ptr *)&local_f8);
          if ((pointer)local_c8._M_allocated_capacity == (pointer)0x0) {
            return;
          }
          (*(code *)local_c8._M_allocated_capacity)(&local_d8,&local_d8,3);
          return;
        }
      }
      else if (((uVar7 & 1) != 0) ||
              (lVar1 = (this->m_timeout).__r,
              lVar2 = *(long *)((long)iVar13.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
                                      ._M_cur + 0x28), tVar12 = time_now(),
              (long)tVar12.__d.__r <= lVar1 + lVar2)) {
        local_58 = *(io_context **)
                    ((long)iVar13.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
                           ._M_cur + 0x30);
        uStack_50 = *(error_category **)
                     ((long)iVar13.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
                            ._M_cur + 0x38);
        paVar4 = (pointer)this->m_ios;
        ::std::
        function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
        ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                    *)&local_d8,local_e0);
        local_b8 = (undefined1  [8])local_58;
        auStack_b0._0_8_ = uStack_50;
        uStack_80._4_4_ = 1;
        local_88 = (undefined1  [8])paVar4;
        plVar14 = (long *)__tls_get_addr(&PTR_004eaf08);
        if (*plVar14 == 0) {
          uVar16 = 0;
        }
        else {
          uVar16 = *(undefined8 *)(*plVar14 + 8);
        }
        local_f8.a = (allocator<void> *)&uStack_80;
        local_f8.v = boost::asio::detail::thread_info_base::
                     allocate<boost::asio::detail::thread_info_base::default_tag>(uVar16,0x50);
        (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_f8.v)->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
        (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_f8.v)->super_scheduler_operation).func_ =
             boost::asio::detail::
             executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:137:17),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
             ::do_complete;
        (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_f8.v)->super_scheduler_operation).task_result_ = 0;
        *(undefined8 *)
         &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
             *)local_f8.v)->handler_).h.super__Function_base._M_functor = 0;
        *(undefined8 *)
         ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                    *)local_f8.v)->handler_).h.super__Function_base._M_functor + 8) = 0;
        (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_f8.v)->handler_).h.super__Function_base._M_manager = (_Manager_type)0x0;
        (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_f8.v)->handler_).h._M_invoker = (_Invoker_type)local_c8._8_8_;
        if ((pointer)local_c8._M_allocated_capacity != (pointer)0x0) {
          *(void **)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                        *)local_f8.v)->handler_).h.super__Function_base._M_functor =
               local_d8._M_unused._M_object;
          *(undefined8 *)
           ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                      *)local_f8.v)->handler_).h.super__Function_base._M_functor + 8) =
               local_d8._8_8_;
          (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
             *)local_f8.v)->handler_).h.super__Function_base._M_manager =
               (_Manager_type)local_c8._M_allocated_capacity;
          local_c8._M_allocated_capacity = 0;
          local_c8._8_8_ = (_Invoker_type)0x0;
        }
        (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_f8.v)->handler_).ec.val_ = local_b8._0_4_;
        (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_f8.v)->handler_).ec.failed_ = (bool)local_b8[4];
        *(undefined3 *)
         &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
             *)local_f8.v)->handler_).ec.field_0x5 = local_b8._5_3_;
        (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_f8.v)->handler_).ec.cat_ = (error_category *)auStack_b0._0_8_;
        local_f8.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                      *)local_f8.v;
        boost::asio::detail::scheduler::post_immediate_completion
                  (*(scheduler **)&(((address_v6 *)((long)local_88 + 8))->addr_).__in6_u,
                   (operation *)local_f8.v,SUB41((uStack_80._4_4_ & 2) >> 1,0));
        local_f8.v = (void *)0x0;
        local_f8.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                      *)0x0;
        boost::asio::detail::
        executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:137:17),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
        ::ptr::reset((ptr *)&local_f8);
        if ((pointer)local_c8._M_allocated_capacity == (pointer)0x0) {
          return;
        }
        (*(code *)local_c8._M_allocated_capacity)(&local_d8,&local_d8,3);
        return;
      }
      this_00 = &this->m_callbacks;
      __position = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
                   ::find(&this_00->_M_t,__k);
      ::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
      ::
      pair<std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
                  *)&local_d8,__k,local_e0);
      local_f8.a = (allocator<void> *)this_00;
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>>
      ::
      _M_insert_equal_<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>>::_Alloc_node>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>>
                  *)this_00,(const_iterator)__position._M_node,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
                  *)&local_d8,(_Alloc_node *)&local_f8);
      if ((code *)stack0xffffffffffffff58 != (code *)0x0) {
        (*(code *)stack0xffffffffffffff58)(local_b8,local_b8,3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_unused._0_8_ != &local_c8) {
        operator_delete(local_d8._M_unused._M_object,(ulong)(local_c8._M_allocated_capacity + 1));
      }
      if ((_Rb_tree_header *)__position._M_node !=
          &(this->m_callbacks)._M_t._M_impl.super__Rb_tree_header) {
        return;
      }
      pcVar10 = (__k->_M_dataplus)._M_p;
      sVar5 = __k->_M_string_length;
      unique0x10001971 = this;
      if ((uVar7 & 2) == 0) {
        local_d8._M_unused._M_object = on_lookup;
        local_d8._8_8_ = 0;
        local_c8._M_allocated_capacity = (size_type)local_b8;
        ::std::__cxx11::string::_M_construct<char*>((string *)&local_c8,pcVar10,pcVar10 + sVar5);
        host_00._M_str = pcVar10;
        host_00._M_len = sVar5;
        service._M_str = "80";
        service._M_len = 2;
        boost::asio::ip::
        basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
        ::
        async_resolve<std::_Bind<void(libtorrent::aux::resolver::*(libtorrent::aux::resolver*,std::_Placeholder<1>,std::_Placeholder<2>,std::__cxx11::string))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,std::__cxx11::string_const&)>>
                  ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                    *)&this->m_critical_resolver,host_00,service,0,
                   (_Bind<void_(libtorrent::aux::resolver::*(libtorrent::aux::resolver_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_d8);
      }
      else {
        local_d8._M_unused._M_object = on_lookup;
        local_d8._8_8_ = 0;
        local_c8._M_allocated_capacity = (size_type)local_b8;
        ::std::__cxx11::string::_M_construct<char*>((string *)&local_c8,pcVar10,pcVar10 + sVar5);
        host_01._M_str = pcVar10;
        host_01._M_len = sVar5;
        service_00._M_str = "80";
        service_00._M_len = 2;
        boost::asio::ip::
        basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
        ::
        async_resolve<std::_Bind<void(libtorrent::aux::resolver::*(libtorrent::aux::resolver*,std::_Placeholder<1>,std::_Placeholder<2>,std::__cxx11::string))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,std::__cxx11::string_const&)>>
                  ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                    *)&this->m_resolver,host_01,service_00,0,
                   (_Bind<void_(libtorrent::aux::resolver::*(libtorrent::aux::resolver_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_d8);
      }
      if ((pointer)local_c8._M_allocated_capacity == (pointer)local_b8) {
        return;
      }
      uVar17 = (long)local_b8 + 1;
      uVar16 = local_c8._M_allocated_capacity;
    }
    else {
      ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
                ((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
                 local_88,(vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                           *)((long)iVar11.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
                                    ._M_cur + 0x30));
      piVar3 = this->m_ios;
      ::std::
      function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
      ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                  *)&local_d8,local_e0);
      local_b8 = (undefined1  [8])0x0;
      auStack_b0._0_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
      ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
                ((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
                 (auStack_b0 + 8),
                 (vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
                 local_88);
      uStack_50 = (error_category *)CONCAT44(1,(undefined4)uStack_50);
      local_58 = piVar3;
      plVar14 = (long *)__tls_get_addr(&PTR_004eaf08);
      if (*plVar14 == 0) {
        uVar16 = 0;
      }
      else {
        uVar16 = *(undefined8 *)(*plVar14 + 8);
      }
      local_f8.a = (allocator<void> *)&uStack_50;
      local_f8.v = boost::asio::detail::thread_info_base::
                   allocate<boost::asio::detail::thread_info_base::default_tag>(uVar16,0x68);
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_f8.v)->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_f8.v)->super_scheduler_operation).func_ =
           boost::asio::detail::
           executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:124:17),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           ::do_complete;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_f8.v)->super_scheduler_operation).task_result_ = 0;
      *(undefined8 *)
       &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_f8.v)->handler_).h.super__Function_base._M_functor = 0;
      *(undefined8 *)
       ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                  *)local_f8.v)->handler_).h.super__Function_base._M_functor + 8) = 0;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_f8.v)->handler_).h.super__Function_base._M_manager = (_Manager_type)0x0;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_f8.v)->handler_).h._M_invoker = (_Invoker_type)local_c8._8_8_;
      if ((pointer)local_c8._M_allocated_capacity != (pointer)0x0) {
        *(void **)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                      *)local_f8.v)->handler_).h.super__Function_base._M_functor =
             local_d8._M_unused._M_object;
        *(undefined8 *)
         ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                    *)local_f8.v)->handler_).h.super__Function_base._M_functor + 8) = local_d8._8_8_
        ;
        (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_f8.v)->handler_).h.super__Function_base._M_manager =
             (_Manager_type)local_c8._M_allocated_capacity;
        local_c8._M_allocated_capacity = 0;
        local_c8._8_8_ = (_Invoker_type)0x0;
      }
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_f8.v)->handler_).ec.val_ = local_b8._0_4_;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_f8.v)->handler_).ec.failed_ = (bool)local_b8[4];
      *(undefined3 *)
       &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_f8.v)->handler_).ec.field_0x5 = local_b8._5_3_;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_f8.v)->handler_).ec.cat_ = (error_category *)auStack_b0._0_8_;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_f8.v)->handler_).ip.type_ = auStack_b0._8_4_;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_f8.v)->handler_).ip.ipv4_address_ = (address_v4)uStack_a4;
      *(pointer *)
       &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_f8.v)->handler_).ip.ipv6_address_.addr_.__in6_u = paStack_a0;
      *(pointer *)
       ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                  *)local_f8.v)->handler_).ip.ipv6_address_.addr_.__in6_u + 8) = paStack_98;
      stack0xffffffffffffff58 = (resolver *)0x0;
      paStack_a0 = (pointer)0x0;
      paStack_98 = (pointer)0x0;
      local_f8.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                    *)local_f8.v;
      boost::asio::detail::scheduler::post_immediate_completion
                (local_58->impl_,(operation *)local_f8.v,SUB41((uStack_50._4_4_ & 2) >> 1,0));
      local_f8.v = (pointer)0x0;
      local_f8.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                    *)0x0;
      boost::asio::detail::
      executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:124:17),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
      ::ptr::reset((ptr *)&local_f8);
      if ((resolver *)stack0xffffffffffffff58 != (resolver *)0x0) {
        operator_delete((void *)stack0xffffffffffffff58,(long)paStack_98 - stack0xffffffffffffff58);
      }
      if ((pointer)local_c8._M_allocated_capacity != (pointer)0x0) {
        (*(code *)local_c8._M_allocated_capacity)(&local_d8,&local_d8,3);
      }
      if (local_88 == (undefined1  [8])0x0) {
        return;
      }
      uVar17 = (long)local_78 - (long)local_88;
      uVar16 = local_88;
    }
    operator_delete((void *)uVar16,uVar17);
    return;
  }
  local_48 = (pointer)0x0;
  paStack_40 = (pointer)0x0;
  uVar18 = 0;
  uVar17 = 0;
  uVar15 = local_d8._0_4_;
LAB_0029f097:
  paVar4 = (pointer)this->m_ios;
  ::std::
  function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
  ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
              *)&local_d8,local_e0);
  local_b8._0_4_ = ipv4;
  local_b8._4_4_ = (in4_addr_type)0x0;
  auStack_b0._0_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
  uStack_a4 = uVar15;
  auStack_b0._8_4_ = uVar18;
  paStack_a0 = local_48;
  paStack_98 = paStack_40;
  uStack_80._4_4_ = 1;
  local_90 = uVar17;
  local_88 = (undefined1  [8])paVar4;
  plVar14 = (long *)__tls_get_addr(&PTR_004eaf08);
  if (*plVar14 == 0) {
    uVar16 = 0;
  }
  else {
    uVar16 = *(undefined8 *)(*plVar14 + 8);
  }
  local_f8.a = (allocator<void> *)&uStack_80;
  local_f8.v = boost::asio::detail::thread_info_base::
               allocate<boost::asio::detail::thread_info_base::default_tag>(uVar16,0x70);
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_f8.v)->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_f8.v)->super_scheduler_operation).func_ =
       boost::asio::detail::
       executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       ::do_complete;
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_f8.v)->super_scheduler_operation).task_result_ = 0;
  *(undefined8 *)
   &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_f8.v)->handler_).h.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
              *)local_f8.v)->handler_).h.super__Function_base._M_functor + 8) = 0;
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_f8.v)->handler_).h.super__Function_base._M_manager = (_Manager_type)0x0;
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_f8.v)->handler_).h._M_invoker = (_Invoker_type)local_c8._8_8_;
  if ((pointer)local_c8._M_allocated_capacity != (pointer)0x0) {
    *(void **)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                  *)local_f8.v)->handler_).h.super__Function_base._M_functor =
         local_d8._M_unused._M_object;
    *(undefined8 *)
     ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                *)local_f8.v)->handler_).h.super__Function_base._M_functor + 8) = local_d8._8_8_;
    (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_f8.v)->handler_).h.super__Function_base._M_manager =
         (_Manager_type)local_c8._M_allocated_capacity;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = (_Invoker_type)0x0;
  }
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_f8.v)->handler_).ec.val_ = local_b8._0_4_;
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_f8.v)->handler_).ec.failed_ = (bool)local_b8[4];
  *(undefined3 *)
   &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_f8.v)->handler_).ec.field_0x5 = local_b8._5_3_;
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_f8.v)->handler_).ec.cat_ = (error_category *)auStack_b0._0_8_;
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_f8.v)->handler_).ip.type_ = auStack_b0._8_4_;
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_f8.v)->handler_).ip.ipv4_address_ = (address_v4)uStack_a4;
  *(pointer *)
   &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       *)local_f8.v)->handler_).ip.ipv6_address_.addr_.__in6_u = paStack_a0;
  *(pointer *)
   ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
              *)local_f8.v)->handler_).ip.ipv6_address_.addr_.__in6_u + 8) = paStack_98;
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_f8.v)->handler_).ip.ipv6_address_.scope_id_ = local_90;
  local_f8.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                *)local_f8.v;
  boost::asio::detail::scheduler::post_immediate_completion
            (*(scheduler **)&(((address_v6 *)((long)local_88 + 8))->addr_).__in6_u,
             (operation *)local_f8.v,SUB41((uStack_80._4_4_ & 2) >> 1,0));
  local_f8.v = (void *)0x0;
  local_f8.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                *)0x0;
  boost::asio::detail::
  executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
  ::ptr::reset(&local_f8);
  if ((pointer)local_c8._M_allocated_capacity != (pointer)0x0) {
    (*(code *)local_c8._M_allocated_capacity)(&local_d8,&local_d8,3);
  }
  return;
}

Assistant:

void resolver::async_resolve(std::string const& host, resolver_flags const flags
		, resolver_interface::callback_t h)
	{
		// special handling for raw IP addresses. There's no need to get in line
		// behind actual lookups if we can just resolve it immediately.
		error_code ec;
		address const ip = make_address(host, ec);
		if (!ec)
		{
			post(m_ios, [h, ec, ip]{ callback(h, ec, std::vector<address>{ip}); });
			return;
		}
		ec.clear();

		auto const i = m_cache.find(host);
		if (i != m_cache.end())
		{
			// keep cache entries valid for m_timeout seconds
			if ((flags & resolver_interface::cache_only)
				|| i->second.last_seen + m_timeout >= time_now())
			{
				std::vector<address> ips = i->second.addresses;
				post(m_ios, [h, ec, ips] { callback(h, ec, ips); });
				return;
			}
		}

		auto const k = m_failed_cache.find(host);
		if (k != m_failed_cache.end())
		{
			// keep cache entries valid for m_timeout seconds
			if ((flags & resolver_interface::cache_only)
				|| k->second.last_seen + m_timeout >= time_now())
			{
				error_code error_code = k->second.error;
				post(m_ios, [h, error_code] { callback(h, error_code, {}); });
				return;
			}
		}

		if (flags & resolver_interface::cache_only)
		{
			// we did not find a cache entry, fail the lookup
			post(m_ios, [h] {
				callback(h, boost::asio::error::host_not_found, std::vector<address>{});
			});
			return;
		}

		auto iter = m_callbacks.find(host);
		bool const done = (iter != m_callbacks.end());

		m_callbacks.insert(iter, {host, std::move(h)});

		// if there is an existing outtanding lookup, our callback will be
		// called once it completes. We're done here.
		if (done) return;

		// the port is ignored
		using namespace std::placeholders;
		ADD_OUTSTANDING_ASYNC("resolver::on_lookup");
		if (flags & resolver_interface::abort_on_shutdown)
		{
			m_resolver.async_resolve(host, "80", std::bind(&resolver::on_lookup, this, _1, _2
				, host));
		}
		else
		{
			m_critical_resolver.async_resolve(host, "80", std::bind(&resolver::on_lookup, this, _1, _2
				, host));
		}
	}